

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC8uvNoLeft_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong *in_RSI;
  uint8_t *in_RDI;
  undefined1 auVar1 [16];
  int DC;
  __m128i sum;
  __m128i top_values;
  __m128i zero;
  undefined4 local_38;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *in_RSI;
  auVar1 = psadbw(auVar1,ZEXT816(0));
  local_38 = auVar1._0_4_;
  Put8x8uv_SSE2((uint8_t)(local_38 + 4 >> 3),in_RDI);
  return;
}

Assistant:

static void DC8uvNoLeft_SSE2(uint8_t* dst) {   // DC with no left samples
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  const int DC = _mm_cvtsi128_si32(sum) + 4;
  Put8x8uv_SSE2(DC >> 3, dst);
}